

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_do_more(connectdata *conn,int *completep)

{
  Curl_easy *pCVar1;
  void *pvVar2;
  _Bool _Var3;
  CURLcode CVar4;
  ftpstate newstate;
  _Bool serv_conned;
  _Bool connected;
  _Bool local_32;
  _Bool local_31;
  
  pCVar1 = conn->data;
  local_31 = false;
  pvVar2 = (pCVar1->req).protop;
  if ((conn->bits).tcpconnect[1] == false) {
    _Var3 = Curl_connect_ongoing(conn);
    if (_Var3) {
      CVar4 = Curl_proxyCONNECT(conn,1,(char *)0x0,0);
      return CVar4;
    }
    CVar4 = Curl_is_connected(conn,1,&local_31);
    if (local_31 == false) {
      if (CVar4 == CURLE_OK) {
        return CURLE_OK;
      }
      if ((conn->proto).ftpc.count1 == 0) {
        *completep = -1;
        CVar4 = ftp_epsv_disable(conn);
        return CVar4;
      }
      return CVar4;
    }
  }
  CVar4 = Curl_proxy_connect(conn,1);
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  if ((((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
      ((conn->bits).proxy_ssl_connected[1] != true)) ||
     (((conn->bits).tunnel_proxy == true &&
      (((conn->bits).httpproxy == true && (_Var3 = Curl_connect_ongoing(conn), _Var3)))))) {
    return CURLE_OK;
  }
  if ((conn->proto).ftpc.state != FTP_STOP) {
    CVar4 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
    *completep = (uint)((conn->proto).ftpc.state == FTP_STOP);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    if ((conn->proto).ftpc.wait_data_conn == false) {
      return CURLE_OK;
    }
    *completep = 0;
  }
  if (1 < *(uint *)((long)pvVar2 + 0x18)) {
    Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
    if ((conn->proto).ftpc.wait_data_conn == false) {
      *completep = 1;
      return CURLE_OK;
    }
    return CURLE_OK;
  }
  if ((conn->proto).ftpc.wait_data_conn == true) {
    CVar4 = ReceivedServerConnect(conn,&local_32);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    if (local_32 != true) {
      return CURLE_OK;
    }
    CVar4 = AcceptServerConnect(conn);
    (conn->proto).ftpc.wait_data_conn = false;
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = InitiateTransfer(conn);
    if (CVar4 == CURLE_OK) {
      *completep = 1;
      return CURLE_OK;
    }
    return CVar4;
  }
  if ((pCVar1->set).upload == true) {
    CVar4 = ftp_nb_type(conn,(pCVar1->set).prefer_ascii,FTP_STOR_TYPE);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
    if ((conn->proto).ftpc.wait_data_conn == true) {
      *completep = 0;
      return CVar4;
    }
    goto LAB_0011504a;
  }
  *(undefined8 *)((long)pvVar2 + 0x20) = 0xffffffffffffffff;
  CVar4 = Curl_range(conn);
  if (CVar4 == CURLE_OK) {
    if (-1 < (pCVar1->req).maxdownload) {
      (conn->proto).ftpc.dont_check = true;
    }
    if (((pCVar1->set).ftp_list_only == false) && ((conn->proto).ftpc.file != (char *)0x0)) {
      _Var3 = (pCVar1->set).prefer_ascii;
      newstate = FTP_RETR_TYPE;
    }
    else {
      if (*(int *)((long)pvVar2 + 0x18) != 0) goto LAB_00115039;
      _Var3 = true;
      newstate = FTP_LIST_TYPE;
    }
    CVar4 = ftp_nb_type(conn,_Var3,newstate);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
  }
LAB_00115039:
  CVar4 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
LAB_0011504a:
  *completep = (uint)((conn->proto).ftpc.state == FTP_STOP);
  return CVar4;
}

Assistant:

static CURLcode ftp_do_more(struct connectdata *conn, int *completep)
{
  struct Curl_easy *data = conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result = CURLE_OK;
  bool connected = FALSE;
  bool complete = FALSE;

  /* the ftp struct is inited in ftp_connect() */
  struct FTP *ftp = data->req.protop;

  /* if the second connection isn't done yet, wait for it */
  if(!conn->bits.tcpconnect[SECONDARYSOCKET]) {
    if(Curl_connect_ongoing(conn)) {
      /* As we're in TUNNEL_CONNECT state now, we know the proxy name and port
         aren't used so we blank their arguments. TODO: make this nicer */
      result = Curl_proxyCONNECT(conn, SECONDARYSOCKET, NULL, 0);

      return result;
    }

    result = Curl_is_connected(conn, SECONDARYSOCKET, &connected);

    /* Ready to do more? */
    if(connected) {
      DEBUGF(infof(data, "DO-MORE connected phase starts\n"));
    }
    else {
      if(result && (ftpc->count1 == 0)) {
        *completep = -1; /* go back to DOING please */
        /* this is a EPSV connect failing, try PASV instead */
        return ftp_epsv_disable(conn);
      }
      return result;
    }
  }

  result = Curl_proxy_connect(conn, SECONDARYSOCKET);
  if(result)
    return result;

  if(CONNECT_SECONDARYSOCKET_PROXY_SSL())
    return result;

  if(conn->bits.tunnel_proxy && conn->bits.httpproxy &&
     Curl_connect_ongoing(conn))
    return result;


  if(ftpc->state) {
    /* already in a state so skip the initial commands.
       They are only done to kickstart the do_more state */
    result = ftp_multi_statemach(conn, &complete);

    *completep = (int)complete;

    /* if we got an error or if we don't wait for a data connection return
       immediately */
    if(result || (ftpc->wait_data_conn != TRUE))
      return result;

    if(ftpc->wait_data_conn)
      /* if we reach the end of the FTP state machine here, *complete will be
         TRUE but so is ftpc->wait_data_conn, which says we need to wait for
         the data connection and therefore we're not actually complete */
      *completep = 0;
  }

  if(ftp->transfer <= FTPTRANSFER_INFO) {
    /* a transfer is about to take place, or if not a file name was given
       so we'll do a SIZE on it later and then we need the right TYPE first */

    if(ftpc->wait_data_conn == TRUE) {
      bool serv_conned;

      result = ReceivedServerConnect(conn, &serv_conned);
      if(result)
        return result; /* Failed to accept data connection */

      if(serv_conned) {
        /* It looks data connection is established */
        result = AcceptServerConnect(conn);
        ftpc->wait_data_conn = FALSE;
        if(!result)
          result = InitiateTransfer(conn);

        if(result)
          return result;

        *completep = 1; /* this state is now complete when the server has
                           connected back to us */
      }
    }
    else if(data->set.upload) {
      result = ftp_nb_type(conn, data->set.prefer_ascii, FTP_STOR_TYPE);
      if(result)
        return result;

      result = ftp_multi_statemach(conn, &complete);
      if(ftpc->wait_data_conn)
        /* if we reach the end of the FTP state machine here, *complete will be
           TRUE but so is ftpc->wait_data_conn, which says we need to wait for
           the data connection and therefore we're not actually complete */
        *completep = 0;
      else
        *completep = (int)complete;
    }
    else {
      /* download */
      ftp->downloadsize = -1; /* unknown as of yet */

      result = Curl_range(conn);

      if(result == CURLE_OK && data->req.maxdownload >= 0) {
        /* Don't check for successful transfer */
        ftpc->dont_check = TRUE;
      }

      if(result)
        ;
      else if(data->set.ftp_list_only || !ftpc->file) {
        /* The specified path ends with a slash, and therefore we think this
           is a directory that is requested, use LIST. But before that we
           need to set ASCII transfer mode. */

        /* But only if a body transfer was requested. */
        if(ftp->transfer == FTPTRANSFER_BODY) {
          result = ftp_nb_type(conn, TRUE, FTP_LIST_TYPE);
          if(result)
            return result;
        }
        /* otherwise just fall through */
      }
      else {
        result = ftp_nb_type(conn, data->set.prefer_ascii, FTP_RETR_TYPE);
        if(result)
          return result;
      }

      result = ftp_multi_statemach(conn, &complete);
      *completep = (int)complete;
    }
    return result;
  }

  if(!result && (ftp->transfer != FTPTRANSFER_BODY))
    /* no data to transfer. FIX: it feels like a kludge to have this here
       too! */
    Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);

  if(!ftpc->wait_data_conn) {
    /* no waiting for the data connection so this is now complete */
    *completep = 1;
    DEBUGF(infof(data, "DO-MORE phase ends with %d\n", (int)result));
  }

  return result;
}